

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

ssize_t __thiscall
QXmlStreamWriterPrivate::write(QXmlStreamWriterPrivate *this,int __fd,void *__buf,size_t __n)

{
  QString *pQVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  char *__buf_00;
  QLatin1StringView str;
  QUtf8StringView str_00;
  QLatin1StringView s;
  
  str_00.m_data = (char *)CONCAT44(in_register_00000034,__fd);
  if (this->device == (QIODevice *)0x0) {
    pQVar1 = this->stringDevice;
    if (pQVar1 != (QString *)0x0) {
      if (((ulong)__buf & 0xc000000000000000) != 0x4000000000000000) {
        str_00.m_size = (ulong)__buf & 0x3fffffffffffffff;
        pQVar1 = QString::append(pQVar1,str_00);
        return (ssize_t)pQVar1;
      }
      str.m_data = str_00.m_data;
      str.m_size = (ulong)__buf & 0x3fffffffffffffff;
      pQVar1 = QString::append(pQVar1,str);
      return (ssize_t)pQVar1;
    }
    str_00.m_data = (char *)write(0,str_00.m_data,(size_t)__buf);
  }
  else if ((this->field_0x78 & 0x20) == 0) {
    __buf_00 = (char *)((ulong)__buf & 0x3fffffffffffffff);
    if (((ulong)__buf & 0xc000000000000000) == 0x4000000000000000) {
      s.m_data = str_00.m_data;
      s.m_size = (qsizetype)__buf_00;
      doWriteToDevice(this,s);
      return extraout_RAX;
    }
    str_00.m_data =
         (char *)QIODevice::write(this->device,__fd,__buf_00,-((ulong)__buf & 0xc000000000000000));
    if (str_00.m_data != __buf_00) {
      this->field_0x78 = this->field_0x78 | 0x20;
    }
  }
  return (ssize_t)str_00.m_data;
}

Assistant:

void QXmlStreamWriterPrivate::write(QAnyStringView s)
{
    if (device) {
        if (hasIoError)
            return;

        s.visit([&] (auto s) { doWriteToDevice(s); });
    } else if (stringDevice) {
        s.visit([&] (auto s) { stringDevice->append(s); });
    } else {
        qWarning("QXmlStreamWriter: No device");
    }
}